

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.hpp
# Opt level: O2

ostream * dump(ostream *os,block *b)

{
  ostream *poVar1;
  string local_48;
  
  poVar1 = std::operator<<(os,"index    = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"timestamp= ");
  format_timestamp_abi_cxx11_(&local_48,b->timestamp);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"prevhash = ");
  poVar1 = std::operator<<(poVar1,(string *)&b->prevsha256);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"hash     = ");
  poVar1 = std::operator<<(poVar1,(string *)&b->sha256);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  return os;
}

Assistant:

inline
std::ostream& dump(std::ostream &os, const block &b) {
    os
    << "index    = " << b.idx << std::endl
    << "timestamp= " << format_timestamp(b.timestamp) << std::endl
    << "prevhash = " << b.prevsha256 << std::endl
    << "hash     = " << b.sha256 << std::endl;

    return os;
}